

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall RealCommandRunner::CanRunMore(RealCommandRunner *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  double dVar4;
  bool local_31;
  bool local_19;
  size_t subproc_number;
  RealCommandRunner *this_local;
  
  sVar2 = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::size
                    (&(this->subprocs_).running_);
  sVar3 = std::queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_>::size
                    (&(this->subprocs_).finished_);
  local_19 = false;
  if ((int)sVar2 + (int)sVar3 < *(int *)(this->config_ + 8)) {
    bVar1 = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::empty
                      (&(this->subprocs_).running_);
    local_31 = true;
    if ((!bVar1) && (local_31 = true, 0.0 < *(double *)(this->config_ + 0x10))) {
      dVar4 = GetLoadAverage();
      local_31 = dVar4 < *(double *)(this->config_ + 0x10);
    }
    local_19 = local_31;
  }
  return local_19;
}

Assistant:

bool RealCommandRunner::CanRunMore() const {
  size_t subproc_number =
      subprocs_.running_.size() + subprocs_.finished_.size();
  return (int)subproc_number < config_.parallelism
    && ((subprocs_.running_.empty() || config_.max_load_average <= 0.0f)
        || GetLoadAverage() < config_.max_load_average);
}